

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_rc_init(AV1EncoderConfig *oxcf,RATE_CONTROL *rc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  rc->frames_since_key = 8;
  rc->frames_to_fwd_kf = (oxcf->kf_cfg).fwd_kf_dist;
  rc->frames_till_gf_update_due = 0;
  rc->ni_av_qi = (oxcf->rc_cfg).worst_allowed_q;
  rc->ni_tot_qi = 0;
  iVar1 = (oxcf->gf_cfg).min_gf_interval;
  rc->min_gf_interval = iVar1;
  iVar3 = (oxcf->gf_cfg).max_gf_interval;
  rc->max_gf_interval = iVar3;
  if (iVar1 == 0) {
    iVar1 = av1_rc_get_default_min_gf_interval
                      ((oxcf->frm_dim_cfg).width,(oxcf->frm_dim_cfg).height,
                       (oxcf->input_cfg).init_framerate);
    rc->min_gf_interval = iVar1;
  }
  if (iVar3 == 0) {
    uVar2 = (uint)((oxcf->input_cfg).init_framerate * 0.75);
    if (0x1f < (int)uVar2) {
      uVar2 = 0x20;
    }
    iVar3 = (uVar2 & 1) + uVar2;
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
    if (iVar3 < 0x21) {
      iVar3 = 0x20;
    }
    rc->max_gf_interval = iVar3;
  }
  rc->avg_frame_low_motion = 0;
  rc->use_external_qp_one_pass = 0;
  rc->percent_blocks_inactive = 0;
  rc->force_max_q = 0;
  rc->postencode_drop = 0;
  rc->frames_since_scene_change = 0;
  rc->resize_state = ORIG;
  rc->resize_avg_qp = 0;
  rc->resize_buffer_underflow = 0;
  rc->resize_count = 0;
  rc->rtc_external_ratectrl = 0;
  rc->frame_level_fast_extra_bits = 0;
  return;
}

Assistant:

void av1_rc_init(const AV1EncoderConfig *oxcf, RATE_CONTROL *rc) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  rc->frames_since_key = 8;  // Sensible default for first frame.
  rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  rc->frames_till_gf_update_due = 0;
  rc->ni_av_qi = rc_cfg->worst_allowed_q;
  rc->ni_tot_qi = 0;

  rc->min_gf_interval = oxcf->gf_cfg.min_gf_interval;
  rc->max_gf_interval = oxcf->gf_cfg.max_gf_interval;
  if (rc->min_gf_interval == 0)
    rc->min_gf_interval = av1_rc_get_default_min_gf_interval(
        oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
        oxcf->input_cfg.init_framerate);
  if (rc->max_gf_interval == 0)
    rc->max_gf_interval = get_default_max_gf_interval(
        oxcf->input_cfg.init_framerate, rc->min_gf_interval);
  rc->avg_frame_low_motion = 0;

  rc->resize_state = ORIG;
  rc->resize_avg_qp = 0;
  rc->resize_buffer_underflow = 0;
  rc->resize_count = 0;
  rc->rtc_external_ratectrl = 0;
  rc->frame_level_fast_extra_bits = 0;
  rc->use_external_qp_one_pass = 0;
  rc->percent_blocks_inactive = 0;
  rc->force_max_q = 0;
  rc->postencode_drop = 0;
  rc->frames_since_scene_change = 0;
}